

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O1

void __thiscall VGMPlayer::Cmd_Port_Ofs8_Data8(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->write8 != (DEVFUNC_WRITE_A8D8)0x0)) {
    (*pCVar1->write8)((pCVar1->base).defInf.dataPtr,this->_fileData[(ulong)this->_filePos + 2],
                      this->_fileData[(ulong)this->_filePos + 3]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Port_Ofs8_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->write8 == NULL)
		return;
	
	cDev->write8(cDev->base.defInf.dataPtr, fData[0x02], fData[0x03]);
	return;
}